

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.c
# Opt level: O0

char * gpps_raw(settings_r *sesskey,char *name,char *def)

{
  undefined8 local_30;
  undefined8 local_28;
  char *ret;
  char *def_local;
  char *name_local;
  settings_r *sesskey_local;
  
  local_28 = read_setting_s(sesskey,name);
  if (local_28 == (char *)0x0) {
    local_28 = platform_default_s(name);
  }
  if (local_28 == (char *)0x0) {
    if (def == (char *)0x0) {
      local_30 = (char *)0x0;
    }
    else {
      local_30 = dupstr(def);
    }
    local_28 = local_30;
  }
  return local_28;
}

Assistant:

static char *gpps_raw(settings_r *sesskey, const char *name, const char *def)
{
    char *ret = read_setting_s(sesskey, name);
    if (!ret)
        ret = platform_default_s(name);
    if (!ret)
        ret = def ? dupstr(def) : NULL;   /* permit NULL as final fallback */
    return ret;
}